

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O2

void __thiscall Example::displayScene(Example *this)

{
  uint i;
  int a;
  ulong uVar1;
  uint j;
  int b;
  Point3 p2;
  Point3 p1;
  Point3 local_68;
  Point3 local_48;
  
  sch::CD_Scene::sceneProximityQuery();
  uVar1 = 0;
  while (a = (int)uVar1,
        uVar1 < (ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3)) {
    for (b = 0; a != b; b = b + 1) {
      local_48.m_x = 0.0;
      local_48.m_y = 0.0;
      local_48.m_z = 0.0;
      local_68.m_x = 0.0;
      local_68.m_y = 0.0;
      local_68.m_z = 0.0;
      sch::CD_Scene::getWitnessPoints(&this->sObj,a,b,&local_48,&local_68);
      sch::CD_Scene::operator()(&this->sObj,a,b);
      sch::CD_Pair::getDistanceWithoutPenetrationDepth();
    }
    uVar1 = (ulong)(a + 1);
  }
  return;
}

Assistant:

void Example::displayScene()
{
  //Calls the computation of the distance (including penertation and witness
  //points) for all the scene, it returns the number of collisions.
  //Other implementations of the scene management could be considered for
  //future versions.
  int collisionNbr = sObj.sceneProximityQuery();

  (void) collisionNbr; ///prevent warning for unused variable

  for (unsigned i=0; i<sObj.size(); ++i)
  {
    for (unsigned j=0; j<i; ++j)
    {
      //Our witness points
      Point3 p1,p2;

      //Get the SQUARED distance and witness points of the last proximity
      //query (see example0.cpp for details on output interpretation)
      //Warning: this does not recompute the distance, even if one object
      //moved after the scene proximity query.
      sObj.getWitnessPoints(i,j,p1,p2);

      //We can get access to the pairs of objects. This will recompute the
      //distance if the objects moved. See example0 for details on how to
      //use the pair object.
      CD_Pair * ptr = sObj(i,j);
      ptr->getDistanceWithoutPenetrationDepth();
    }
  }
}